

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2i.c
# Opt level: O3

void Int2_ManStop(Int2_Man_t *p)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  
  if (p != (Int2_Man_t *)0x0) {
    Gia_ManStopP(&p->pGia);
    pVVar1 = p->vGloVars;
    piVar2 = pVVar1->pArray;
    if (piVar2 != (int *)0x0) {
      free(piVar2);
    }
    free(pVVar1);
    pVVar1 = p->vVar2Glo;
    piVar2 = pVVar1->pArray;
    if (piVar2 != (int *)0x0) {
      free(piVar2);
    }
    free(pVVar1);
    free(p);
    return;
  }
  return;
}

Assistant:

void Int2_ManStop( Int2_Man_t * p )
{
    if ( p == NULL )
        return;
    Gia_ManStopP( &p->pGia );
    Vec_IntFree( p->vGloVars );
    Vec_IntFree( p->vVar2Glo );
    ABC_FREE( p );
}